

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::CordFieldGenerator::GenerateAccessorDeclarations
          (CordFieldGenerator *this,Printer *printer)

{
  tuple<const_google::protobuf::FieldDescriptor_*,_google::protobuf::GeneratedCodeInfo_Annotation_Semantic>
  local_60 [2];
  undefined1 local_40 [8];
  Formatter format;
  Printer *printer_local;
  CordFieldGenerator *this_local;
  
  format.vars_.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.slot_array = (MaybeInitializedPtr)printer;
  Formatter::Formatter((Formatter *)local_40,printer,&(this->super_FieldGeneratorBase).variables_);
  Formatter::operator()
            ((Formatter *)local_40,"$deprecated_attr$const ::absl::Cord& ${1$$name$$}$() const;\n",
             &(this->super_FieldGeneratorBase).field_);
  std::
  make_tuple<google::protobuf::FieldDescriptor_const*const&,google::protobuf::GeneratedCodeInfo_Annotation_Semantic_const&>
            ((FieldDescriptor **)local_60,
             (GeneratedCodeInfo_Annotation_Semantic *)&(this->super_FieldGeneratorBase).field_);
  Formatter::operator()
            ((Formatter *)local_40,
             "$deprecated_attr$void ${1$set_$name$$}$(const ::absl::Cord& value);\n$deprecated_attr$void ${1$set_$name$$}$(::absl::string_view value);\n"
             ,local_60);
  Formatter::operator()
            ((Formatter *)local_40,
             "private:\nconst ::absl::Cord& ${1$_internal_$name$$}$() const;\nvoid ${1$_internal_set_$name$$}$(const ::absl::Cord& value);\n::absl::Cord* $nonnull$ ${1$_internal_mutable_$name$$}$();\npublic:\n"
             ,&(this->super_FieldGeneratorBase).field_);
  Formatter::~Formatter((Formatter *)local_40);
  return;
}

Assistant:

void CordFieldGenerator::GenerateAccessorDeclarations(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  format("$deprecated_attr$const ::absl::Cord& ${1$$name$$}$() const;\n",
         field_);
  format(
      "$deprecated_attr$void ${1$set_$name$$}$(const ::absl::Cord& value);\n"
      "$deprecated_attr$void ${1$set_$name$$}$(::absl::string_view value);\n",
      std::make_tuple(field_, GeneratedCodeInfo::Annotation::SET));
  format(
      "private:\n"
      "const ::absl::Cord& ${1$_internal_$name$$}$() const;\n"
      "void ${1$_internal_set_$name$$}$(const ::absl::Cord& value);\n"
      "::absl::Cord* $nonnull$ ${1$_internal_mutable_$name$$}$();\n"
      "public:\n",
      field_);
}